

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall kj::Path::Path(Path *this,StringPtr name)

{
  char *pcVar1;
  size_t sVar2;
  String local_28;
  
  heapString(&local_28,name.content.ptr,name.content.size_ - 1);
  Path(this,&local_28);
  sVar2 = local_28.content.size_;
  pcVar1 = local_28.content.ptr;
  if (local_28.content.ptr != (char *)0x0) {
    local_28.content.ptr = (char *)0x0;
    local_28.content.size_ = 0;
    (**(local_28.content.disposer)->_vptr_ArrayDisposer)
              (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

Path::Path(StringPtr name): Path(heapString(name)) {}